

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_array_indexOf(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValueUnion JVar1;
  JSValue JVar2;
  int iVar3;
  BOOL BVar4;
  JSValueUnion JVar5;
  double dVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int64_t iVar10;
  int64_t *piVar11;
  JSRefCountHeader *p;
  bool bVar12;
  JSValue JVar13;
  JSValue op2;
  int64_t len;
  JSValue val;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  JSValue local_40;
  
  JVar13 = JS_ToObject(ctx,this_val);
  JVar5 = JVar13.u;
  iVar3 = js_get_length64(ctx,(int64_t *)&local_48,JVar13);
  uVar7 = (uint)JVar13.tag;
  if (iVar3 == 0) {
    local_58 = local_48;
    uVar8 = 0xffffffffffffffff;
    if (0 < (long)local_48) {
      local_60 = 0;
      if ((1 < argc) &&
         (iVar3 = JS_ToInt64Clamp(ctx,(int64_t *)&local_60,argv[1],0,local_48,local_48), iVar3 != 0)
         ) goto LAB_00162640;
      uVar9 = local_60;
      if ((uVar7 == 0xffffffff) &&
         (((*(short *)((long)JVar5.ptr + 6) == 2 && ((*(byte *)((long)JVar5.ptr + 5) & 8) != 0)) &&
          (local_50 = (ulong)*(uint *)((long)JVar5.ptr + 0x40), (long)local_60 < (long)local_50))))
      {
        piVar11 = (int64_t *)(local_60 * 0x10 + *(long *)((long)JVar5.ptr + 0x38) + 8);
        uVar8 = local_60;
        do {
          JVar2 = *argv;
          if (0xfffffff4 < (uint)argv->tag) {
            *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
          }
          JVar1 = (JSValueUnion)((JSValueUnion *)(piVar11 + -1))->ptr;
          iVar10 = *piVar11;
          if (0xfffffff4 < (uint)iVar10) {
            *(int *)JVar1.ptr = *JVar1.ptr + 1;
          }
          op2.tag = iVar10;
          op2.u.ptr = JVar1.ptr;
          BVar4 = js_strict_eq2(ctx,JVar2,op2,JS_EQ_STRICT);
          if (BVar4 != 0) goto LAB_001627af;
          uVar8 = uVar8 + 1;
          piVar11 = piVar11 + 2;
          uVar9 = local_50;
        } while (local_50 != uVar8);
      }
      local_60 = uVar9;
      uVar9 = local_60;
      uVar8 = 0xffffffffffffffff;
      if ((long)local_60 < (long)local_58) {
        do {
          iVar3 = JS_TryGetPropertyInt64(ctx,JVar13,uVar9,&local_40);
          if (iVar3 < 0) goto LAB_00162640;
          if (iVar3 != 0) {
            JVar2 = *argv;
            if (0xfffffff4 < (uint)argv->tag) {
              *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
            }
            BVar4 = js_strict_eq2(ctx,JVar2,local_40,JS_EQ_STRICT);
            uVar8 = uVar9;
            if (BVar4 != 0) break;
          }
          uVar9 = uVar9 + 1;
          uVar8 = 0xffffffffffffffff;
        } while (local_58 != uVar9);
      }
    }
LAB_001627af:
    if ((0xfffffff4 < uVar7) && (iVar3 = *JVar5.ptr, *(int *)JVar5.ptr = iVar3 + -1, iVar3 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar13);
    }
    bVar12 = (long)(int)uVar8 == uVar8;
    dVar6 = (double)(long)uVar8;
    if (bVar12) {
      dVar6 = (double)(uVar8 & 0xffffffff);
    }
    iVar10 = 7;
    if (bVar12) {
      iVar10 = 0;
    }
    uVar9 = (ulong)dVar6 & 0xffffffff00000000;
    uVar8 = (ulong)dVar6 & 0xffffffff;
  }
  else {
LAB_00162640:
    iVar10 = 6;
    if ((0xfffffff4 < uVar7) && (iVar3 = *JVar5.ptr, *(int *)JVar5.ptr = iVar3 + -1, iVar3 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar13);
    }
    uVar8 = 0;
    uVar9 = 0;
  }
  JVar13.u.ptr = (void *)(uVar8 | uVar9);
  JVar13.tag = iVar10;
  return JVar13;
}

Assistant:

static JSValue js_array_indexOf(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSValue obj, val;
    int64_t len, n, res;
    JSValue *arrp;
    uint32_t count;

    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    res = -1;
    if (len > 0) {
        n = 0;
        if (argc > 1) {
            if (JS_ToInt64Clamp(ctx, &n, argv[1], 0, len, len))
                goto exception;
        }
        if (js_get_fast_array(ctx, obj, &arrp, &count)) {
            for (; n < count; n++) {
                if (js_strict_eq2(ctx, JS_DupValue(ctx, argv[0]),
                                  JS_DupValue(ctx, arrp[n]), JS_EQ_STRICT)) {
                    res = n;
                    goto done;
                }
            }
        }
        for (; n < len; n++) {
            int present = JS_TryGetPropertyInt64(ctx, obj, n, &val);
            if (present < 0)
                goto exception;
            if (present) {
                if (js_strict_eq2(ctx, JS_DupValue(ctx, argv[0]), val, JS_EQ_STRICT)) {
                    res = n;
                    break;
                }
            }
        }
    }
 done:
    JS_FreeValue(ctx, obj);
    return JS_NewInt64(ctx, res);

 exception:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}